

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGen::SubDirPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename)

{
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  size_type slashPos;
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  slashPos = (size_type)this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                       ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,'/',
                        0xffffffffffffffff);
  if (local_28 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&slashPos,0,
                          local_28 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_38,&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::SubDirPrefix(cm::string_view filename)
{
  auto slashPos = filename.rfind('/');
  if (slashPos == cm::string_view::npos) {
    return std::string();
  }
  return std::string(filename.substr(0, slashPos + 1));
}